

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O3

void Gia_ManFindChains(Gia_Man_t *p,Vec_Int_t *vFadds,Vec_Int_t *vMap)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vLength;
  int *__s;
  long lVar3;
  long lVar4;
  
  iVar2 = p->nObjs;
  vLength = (Vec_Int_t *)malloc(0x10);
  iVar1 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar1 = iVar2;
  }
  vLength->nCap = iVar1;
  if (iVar1 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar1 << 2);
  }
  vLength->pArray = __s;
  vLength->nSize = iVar2;
  memset(__s,0xff,(long)iVar2 << 2);
  iVar2 = vFadds->nSize;
  if (4 < iVar2) {
    lVar4 = 4;
    lVar3 = 0;
    do {
      if (iVar2 <= lVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Gia_ManFindChains_rec(p,vFadds->pArray[lVar4],vFadds,vMap,vLength);
      lVar3 = lVar3 + 1;
      iVar2 = vFadds->nSize;
      lVar4 = lVar4 + 5;
    } while (lVar3 < iVar2 / 5);
    __s = vLength->pArray;
  }
  if (__s != (int *)0x0) {
    free(__s);
  }
  free(vLength);
  return;
}

Assistant:

void Gia_ManFindChains( Gia_Man_t * p, Vec_Int_t * vFadds, Vec_Int_t * vMap )
{
    int i;
    // for each FADD find the longest chain rooted in it
    Vec_Int_t * vLength = Vec_IntStartFull( Gia_ManObjNum(p) );
    Dtc_ForEachFadd( vFadds, i )
        Gia_ManFindChains_rec( p, Vec_IntEntry(vFadds, 5*i+4), vFadds, vMap, vLength );
    Vec_IntFree( vLength );
}